

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

index_type *
booster::locale::boundary::details::
mapping_traits<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::random_access_iterator_tag>
::map(boundary_type t,
     __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
     b,__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
       e,locale *l)

{
  bool bVar1;
  reference pwVar2;
  difference_type dVar3;
  boundary_indexing<wchar_t> *pbVar4;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *this;
  long lVar5;
  long lVar6;
  undefined8 in_RCX;
  wchar_t *in_RDX;
  undefined4 in_ESI;
  index_type *in_RDI;
  index_type tmp_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> str;
  index_type tmp;
  char_type *end;
  char_type *begin;
  index_type *result;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  locale *in_stack_ffffffffffffff00;
  allocator<wchar_t> *in_stack_ffffffffffffff08;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff10;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __end;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_ffffffffffffff20;
  undefined1 local_b8 [31];
  allocator<wchar_t> local_99;
  undefined8 local_98;
  wchar_t *local_90;
  wstring local_88 [48];
  undefined1 local_58 [24];
  reference local_40;
  reference local_38;
  undefined1 local_29;
  undefined4 local_1c;
  undefined8 local_18;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_10 [2];
  
  local_29 = 0;
  local_1c = in_ESI;
  local_18 = in_RCX;
  local_10[0]._M_current = in_RDX;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)0x164cc8);
  bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar1) {
    pwVar2 = __gnu_cxx::
             __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(local_10);
    local_38 = pwVar2;
    dVar3 = __gnu_cxx::operator-(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_40 = pwVar2 + dVar3;
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<wchar_t>>
                       (in_stack_ffffffffffffff00);
    (**(code **)(*(long *)pbVar4 + 0x10))(local_58,pbVar4,local_1c,local_38,local_40);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::swap((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)in_stack_ffffffffffffff00,
           (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)in_stack_ffffffffffffff00);
  }
  else {
    local_90 = local_10[0]._M_current;
    local_98 = local_18;
    __end._M_current = (wchar_t *)&local_99;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::
    wstring<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff20,__end,in_stack_ffffffffffffff08);
    std::allocator<wchar_t>::~allocator(&local_99);
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<wchar_t>>
                       (in_stack_ffffffffffffff00);
    this = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)std::__cxx11::wstring::c_str();
    lVar5 = std::__cxx11::wstring::c_str();
    lVar6 = std::__cxx11::wstring::size();
    (**(code **)(*(long *)pbVar4 + 0x10))(local_b8,pbVar4,local_1c,this,lVar5 + lVar6 * 4);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::swap(this,(vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 *)CONCAT44(local_1c,in_stack_fffffffffffffef8));
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~vector(this);
    std::__cxx11::wstring::~wstring(local_88);
  }
  return in_RDI;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        index_type result;

                        //
                        // Optimize for most common cases
                        //
                        // C++0x requires that string is continious in memory and all known
                        // string implementations
                        // do this because of c_str() support. 
                        //

                        if(linear_iterator_traits<char_type,IteratorType>::is_linear && b!=e)
                        {
                            char_type const *begin = &*b;
                            char_type const *end = begin + (e-b);
                            index_type tmp=std::use_facet<boundary_indexing<char_type> >(l).map(t,begin,end);
                            result.swap(tmp);
                        }
                        else {
                            std::basic_string<char_type> str(b,e);
                            index_type tmp = std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                            result.swap(tmp);
                        }
                        return result;
                    }